

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

long duckdb::DecimalScaleDownCheckOperator::Operation<duckdb::hugeint_t,long>
               (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  long lVar2;
  duckdb *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint8_t in_R9B;
  undefined7 in_register_00000089;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t value;
  string error;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  input_00.lower = input.upper;
  this = (duckdb *)input.lower;
  input_00.upper = (int64_t)dataptr;
  bVar1 = CanScaleDownDecimal<duckdb::hugeint_t>
                    (this,input_00,(DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> *)idx);
  if (bVar1) {
    input_01.upper = (int64_t)mask;
    input_01.lower = input_00.lower;
    lVar2 = DecimalScaleDownOperator::Operation<duckdb::hugeint_t,long>
                      ((DecimalScaleDownOperator *)this,input_01,(ValidityMask *)idx,(idx_t)dataptr,
                       (void *)CONCAT71(in_register_00000089,in_R9B));
    return lVar2;
  }
  local_b0[0] = local_a0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"Casting value \"%s\" to type %s failed: value is out of range!","")
  ;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(byte *)((long)dataptr + 0x41);
  value.upper._0_1_ = *(undefined1 *)((long)dataptr + 0x40);
  value.lower = input_00.lower;
  value.upper._1_7_ = 0;
  Decimal::ToString_abi_cxx11_
            (&local_70,(Decimal *)this,value,*(byte *)((long)dataptr + 0x41),in_R9B);
  LogicalType::ToString_abi_cxx11_(&local_90,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_50,(StringUtil *)local_b0,&local_70,&local_90,params_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar2 = HandleVectorCastError::Operation<long>
                    (&local_50,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return lVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = static_cast<DecimalScaleInput<INPUT_TYPE> *>(dataptr);
		if (!CanScaleDownDecimal(input, *data)) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return DecimalScaleDownOperator::Operation<INPUT_TYPE, RESULT_TYPE>(input, mask, idx, dataptr);
	}